

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O1

double inform_range(double *series,size_t n,double *min,double *max,inform_error *err)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (series == (double *)0x0) {
    dVar2 = 0.0;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
      return dVar2;
    }
  }
  else if (n == 0) {
    dVar2 = 0.0;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
      return dVar2;
    }
  }
  else {
    dVar2 = *series;
    dVar3 = dVar2;
    if (n != 1) {
      sVar1 = 1;
      dVar4 = dVar2;
      dVar5 = dVar2;
      do {
        dVar2 = series[sVar1];
        dVar3 = dVar2;
        if (dVar5 <= dVar2) {
          dVar3 = dVar5;
        }
        if (dVar2 <= dVar4) {
          dVar2 = dVar4;
        }
        sVar1 = sVar1 + 1;
        dVar4 = dVar2;
        dVar5 = dVar3;
      } while (n != sVar1);
    }
    if (min != (double *)0x0) {
      *min = dVar3;
    }
    if (max != (double *)0x0) {
      *max = dVar2;
    }
    dVar2 = dVar2 - dVar3;
  }
  return dVar2;
}

Assistant:

double inform_range(double const *series, size_t n, double *min, double *max,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);

    double a = series[0], b = series[0];
    for (size_t i = 1; i < n; ++i)
    {
        if (series[i] < a) a = series[i];
        if (b < series[i]) b = series[i];
    }
    if (min != NULL) *min = a;
    if (max != NULL) *max = b;
    return (b - a);
}